

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SnippetFindPositions(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  char *local_38;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)((long)ctx + 0x18);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  *(int *)(lVar7 + (long)iPhrase * 0x30) = pExpr->pPhrase->nToken;
  iVar2 = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),&local_38);
  pcVar1 = local_38;
  iVar4 = iVar2;
  if (local_38 != (char *)0x0) {
    lVar7 = lVar7 + (long)iPhrase * 0x30;
    *(char **)(lVar7 + 8) = local_38;
    if (*local_38 < '\0') {
      local_2c = -0x55555556;
      uVar3 = sqlite3Fts3GetVarint32(local_38,&local_2c);
      uVar6 = (ulong)uVar3;
      iVar5 = local_2c;
    }
    else {
      uVar6 = 1;
      iVar5 = (int)*local_38;
    }
    iVar4 = 0x10b;
    if (1 < iVar5) {
      *(char **)(lVar7 + 0x18) = pcVar1 + uVar6;
      *(char **)(lVar7 + 0x28) = pcVar1 + uVar6;
      *(ulong *)(lVar7 + 0x10) = (ulong)(iVar5 - 2);
      *(ulong *)(lVar7 + 0x20) = (ulong)(iVar5 - 2);
      iVar4 = iVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts3SnippetFindPositions(Fts3Expr *pExpr, int iPhrase, void *ctx){
  SnippetIter *p = (SnippetIter *)ctx;
  SnippetPhrase *pPhrase = &p->aPhrase[iPhrase];
  char *pCsr;
  int rc;

  pPhrase->nToken = pExpr->pPhrase->nToken;
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( pCsr ){
    i64 iFirst = 0;
    pPhrase->pList = pCsr;
    fts3GetDeltaPosition(&pCsr, &iFirst);
    if( iFirst<0 ){
      rc = FTS_CORRUPT_VTAB;
    }else{
      pPhrase->pHead = pCsr;
      pPhrase->pTail = pCsr;
      pPhrase->iHead = iFirst;
      pPhrase->iTail = iFirst;
    }
  }else{
    assert( rc!=SQLITE_OK || (
       pPhrase->pList==0 && pPhrase->pHead==0 && pPhrase->pTail==0
    ));
  }

  return rc;
}